

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

void construct_block_size_descriptor_2d
               (uint x_texels,uint y_texels,bool can_omit_modes,float mode_cutoff,
               block_size_descriptor *bsd)

{
  quant_method qVar1;
  uint uVar2;
  dt_init_working_buffers *this;
  char *in_RCX;
  byte in_DL;
  uint in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  uint i_3;
  decimation_mode *dm;
  block_mode *bm;
  int decimation_mode;
  bool percentile_hit;
  bool valid;
  uint weight_bits;
  uint quant_mode;
  bool is_dual_plane;
  uint y_weights;
  uint x_weights;
  uint i_2;
  uint j;
  uint limit;
  uint i_1;
  uint dm_counts [4];
  uint bm_counts [4];
  uint packed_dm_idx;
  uint packed_bm_idx;
  float always_cutoff;
  float *percentiles;
  uint i;
  dt_init_working_buffers *wb;
  int decimation_mode_index [204];
  dt_init_working_buffers *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  dt_init_working_buffers *in_stack_fffffffffffffc28;
  block_mode *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  undefined2 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc42;
  undefined1 in_stack_fffffffffffffc43;
  int in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc48;
  uint in_stack_fffffffffffffc4c;
  uint in_stack_fffffffffffffc50;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_39c;
  int local_398 [4];
  int local_388 [7];
  int local_36c;
  uint local_368;
  float local_364;
  float *local_360;
  uint local_354;
  void *local_350;
  int aiStack_348 [18];
  block_size_descriptor *in_stack_fffffffffffffd00;
  
  local_350 = operator_new(0x73d8);
  *in_RCX = (char)in_EDI;
  in_RCX[1] = (char)in_ESI;
  in_RCX[2] = '\x01';
  in_RCX[3] = (char)in_EDI * (char)in_ESI;
  for (local_354 = 0; local_354 < 0xcc; local_354 = local_354 + 1) {
    aiStack_348[local_354] = -1;
  }
  local_360 = get_2d_percentile_table
                        ((uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                         (uint)in_stack_fffffffffffffc30);
  local_364 = 0.0;
  local_368 = 0;
  local_36c = 0;
  memset(local_388,0,0x10);
  memset(local_398,0,0x10);
  for (local_39c = 0; local_39c < 0x800; local_39c = local_39c + 1) {
    (in_RCX + (ulong)local_39c * 2 + 0xac7ae0)[0] = -1;
    (in_RCX + (ulong)local_39c * 2 + 0xac7ae0)[1] = -1;
  }
  uVar2 = 4;
  if ((in_DL & 1) != 0) {
    uVar2 = 3;
  }
  local_3a4 = 0;
  do {
    if (uVar2 <= local_3a4) {
      *(int *)(in_RCX + 0x10) = local_388[0];
      *(int *)(in_RCX + 0x14) = local_388[0] + local_388[1];
      *(int *)(in_RCX + 0x18) = local_388[0] + local_388[1] + local_388[2];
      *(int *)(in_RCX + 0x1c) = local_388[0] + local_388[1] + local_388[2] + local_388[3];
      *(int *)(in_RCX + 4) = local_398[0];
      *(int *)(in_RCX + 8) = local_398[0] + local_398[1] + local_398[2];
      *(int *)(in_RCX + 0xc) = local_398[0] + local_398[1] + local_398[2] + local_398[3];
      if (*(int *)(in_RCX + 0x10) == 0) {
        __assert_fail("bsd.block_mode_count_1plane_always > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                      ,0x3c1,
                      "void construct_block_size_descriptor_2d(unsigned int, unsigned int, bool, float, block_size_descriptor &)"
                     );
      }
      if (*(int *)(in_RCX + 4) == 0) {
        __assert_fail("bsd.decimation_mode_count_always > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                      ,0x3c2,
                      "void construct_block_size_descriptor_2d(unsigned int, unsigned int, bool, float, block_size_descriptor &)"
                     );
      }
      if (local_360 != (float *)0x0) {
        operator_delete__(local_360);
      }
      for (uVar2 = *(uint *)(in_RCX + 0xc); uVar2 < 0x57; uVar2 = uVar2 + 1) {
        in_RCX[(ulong)uVar2 * 6 + 0x40] = -1;
        in_RCX[(ulong)uVar2 * 6 + 0x41] = -1;
        (in_RCX + (ulong)uVar2 * 6 + 0x42)[0] = '\0';
        (in_RCX + (ulong)uVar2 * 6 + 0x42)[1] = '\0';
        (in_RCX + (ulong)uVar2 * 6 + 0x44)[0] = '\0';
        (in_RCX + (ulong)uVar2 * 6 + 0x44)[1] = '\0';
      }
      assign_kmeans_texels(in_stack_fffffffffffffd00);
      if (local_350 != (void *)0x0) {
        operator_delete(local_350,0x73d8);
      }
      return;
    }
    for (local_3a8 = 0; local_3a8 < 0x800; local_3a8 = local_3a8 + 1) {
      if (((((*(short *)(in_RCX + (ulong)local_3a8 * 2 + 0xac7ae0) == -1) &&
            (in_stack_fffffffffffffc43 =
                  decode_block_mode_2d
                            (in_stack_fffffffffffffc50,
                             (uint *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                             (uint *)CONCAT44(in_stack_fffffffffffffc44,
                                              CONCAT13(in_stack_fffffffffffffc43,
                                                       CONCAT12(in_stack_fffffffffffffc42,
                                                                in_stack_fffffffffffffc40))),
                             (bool *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                             (uint *)in_stack_fffffffffffffc30,(uint *)in_stack_fffffffffffffc28),
            (bool)in_stack_fffffffffffffc43)) && (local_3ac <= in_EDI)) &&
          (in_stack_fffffffffffffc50 <= in_ESI)) &&
         (((1 < local_3a4 || ((in_stack_fffffffffffffc4c & 0x1000000) == 0)) &&
          ((local_3a4 != 2 || ((in_stack_fffffffffffffc4c & 0x1000000) != 0)))))) {
        if ((in_stack_fffffffffffffc4c & 0x1000000) == 0) {
          if (in_stack_fffffffffffffc44 != 0x6f) goto LAB_0056362e;
        }
        else if (in_stack_fffffffffffffc44 != 0x6d) {
LAB_0056362e:
          if (local_3a4 == 0) {
            in_stack_fffffffffffffc42 = local_360[local_3a8] <= local_364;
          }
          else {
            in_stack_fffffffffffffc42 = local_360[local_3a8] <= in_XMM0_Da;
          }
          if ((local_3a4 == 3) || ((bool)in_stack_fffffffffffffc42 != false)) {
            in_stack_fffffffffffffc3c = aiStack_348[in_stack_fffffffffffffc50 * 0x10 + local_3ac];
            if (in_stack_fffffffffffffc3c < 0) {
              construct_dt_entry_2d
                        ((uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                         (uint)in_stack_fffffffffffffc30,
                         (uint)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                         (uint)in_stack_fffffffffffffc28,
                         (block_size_descriptor *)
                         CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc18,
                         CONCAT13(in_stack_fffffffffffffc43,
                                  CONCAT12(in_stack_fffffffffffffc42,in_stack_fffffffffffffc40)));
              in_stack_fffffffffffffc3c = local_36c;
              aiStack_348[in_stack_fffffffffffffc50 * 0x10 + local_3ac] = local_36c;
              local_398[local_3a4] = local_398[local_3a4] + 1;
              local_36c = local_36c + 1;
            }
            in_stack_fffffffffffffc30 = (block_mode *)(in_RCX + (ulong)local_368 * 6 + 0xac8ae0);
            in_stack_fffffffffffffc30->decimation_mode = (uint8_t)in_stack_fffffffffffffc3c;
            in_stack_fffffffffffffc30->quant_mode = (uint8_t)in_stack_fffffffffffffc48;
            in_stack_fffffffffffffc30->field_0x5 =
                 in_stack_fffffffffffffc30->field_0x5 & 0xfe |
                 (byte)(in_stack_fffffffffffffc4c >> 0x18) & 1;
            in_stack_fffffffffffffc30->weight_bits = (uint8_t)in_stack_fffffffffffffc44;
            in_stack_fffffffffffffc30->mode_index = (uint16_t)local_3a8;
            this = (dt_init_working_buffers *)(in_RCX + (long)in_stack_fffffffffffffc3c * 6 + 0x40);
            in_stack_fffffffffffffc28 = this;
            if ((in_stack_fffffffffffffc4c & 0x1000000) == 0) {
              qVar1 = block_mode::get_weight_quant_mode(in_stack_fffffffffffffc30);
              ::decimation_mode::set_ref_1plane((decimation_mode *)this,qVar1);
            }
            else {
              qVar1 = block_mode::get_weight_quant_mode(in_stack_fffffffffffffc30);
              ::decimation_mode::set_ref_2plane((decimation_mode *)this,qVar1);
              in_stack_fffffffffffffc18 = this;
            }
            *(short *)(in_RCX + (ulong)local_3a8 * 2 + 0xac7ae0) = (short)local_368;
            local_368 = local_368 + 1;
            local_388[local_3a4] = local_388[local_3a4] + 1;
          }
        }
      }
    }
    local_3a4 = local_3a4 + 1;
  } while( true );
}

Assistant:

static void construct_block_size_descriptor_2d(
	unsigned int x_texels,
	unsigned int y_texels,
	bool can_omit_modes,
	float mode_cutoff,
	block_size_descriptor& bsd
) {
	// Store a remap table for storing packed decimation modes.
	// Indexing uses [Y * 16 + X] and max size for each axis is 12.
	static const unsigned int MAX_DMI = 12 * 16 + 12;
	int decimation_mode_index[MAX_DMI];

	dt_init_working_buffers* wb = new dt_init_working_buffers;

	bsd.xdim = static_cast<uint8_t>(x_texels);
	bsd.ydim = static_cast<uint8_t>(y_texels);
	bsd.zdim = 1;
	bsd.texel_count = static_cast<uint8_t>(x_texels * y_texels);

	for (unsigned int i = 0; i < MAX_DMI; i++)
	{
		decimation_mode_index[i] = -1;
	}

	// Gather all the decimation grids that can be used with the current block
#if !defined(ASTCENC_DECOMPRESS_ONLY)
	const float *percentiles = get_2d_percentile_table(x_texels, y_texels);
	float always_cutoff = 0.0f;
#else
	// Unused in decompress-only builds
	(void)can_omit_modes;
	(void)mode_cutoff;
#endif

	// Construct the list of block formats referencing the decimation tables
	unsigned int packed_bm_idx = 0;
	unsigned int packed_dm_idx = 0;

	// Trackers
	unsigned int bm_counts[4] { 0 };
	unsigned int dm_counts[4] { 0 };

	// Clear the list to a known-bad value
	for (unsigned int i = 0; i < WEIGHTS_MAX_BLOCK_MODES; i++)
	{
		bsd.block_mode_packed_index[i] = BLOCK_BAD_BLOCK_MODE;
	}

	// Iterate four times to build a usefully ordered list:
	//   - Pass 0 - keep selected single plane "always" block modes
	//   - Pass 1 - keep selected single plane "non-always" block modes
	//   - Pass 2 - keep select dual plane block modes
	//   - Pass 3 - keep everything else that's legal
	unsigned int limit = can_omit_modes ? 3 : 4;
	for (unsigned int j = 0; j < limit; j ++)
	{
		for (unsigned int i = 0; i < WEIGHTS_MAX_BLOCK_MODES; i++)
		{
			// Skip modes we've already included in a previous pass
			if (bsd.block_mode_packed_index[i] != BLOCK_BAD_BLOCK_MODE)
			{
				continue;
			}

			// Decode parameters
			unsigned int x_weights;
			unsigned int y_weights;
			bool is_dual_plane;
			unsigned int quant_mode;
			unsigned int weight_bits;
			bool valid = decode_block_mode_2d(i, x_weights, y_weights, is_dual_plane, quant_mode, weight_bits);

			// Always skip invalid encodings for the current block size
			if (!valid || (x_weights > x_texels) || (y_weights > y_texels))
			{
				continue;
			}

			// Selectively skip dual plane encodings
			if (((j <= 1) && is_dual_plane) || (j == 2 && !is_dual_plane))
			{
				continue;
			}

			// Always skip encodings we can't physically encode based on
			// generic encoding bit availability
			if (is_dual_plane)
			{
				 // This is the only check we need as only support 1 partition
				 if ((109 - weight_bits) <= 0)
				 {
					continue;
				 }
			}
			else
			{
				// This is conservative - fewer bits may be available for > 1 partition
				 if ((111 - weight_bits) <= 0)
				 {
					continue;
				 }
			}

			// Selectively skip encodings based on percentile
			bool percentile_hit = false;
	#if !defined(ASTCENC_DECOMPRESS_ONLY)
			if (j == 0)
			{
				percentile_hit = percentiles[i] <= always_cutoff;
			}
			else
			{
				percentile_hit = percentiles[i] <= mode_cutoff;
			}
	#endif

			if (j != 3 && !percentile_hit)
			{
				continue;
			}

			// Allocate and initialize the decimation table entry if we've not used it yet
			int decimation_mode = decimation_mode_index[y_weights * 16 + x_weights];
			if (decimation_mode < 0)
			{
				construct_dt_entry_2d(x_texels, y_texels, x_weights, y_weights, bsd, *wb, packed_dm_idx);
				decimation_mode_index[y_weights * 16 + x_weights] = packed_dm_idx;
				decimation_mode = packed_dm_idx;

				dm_counts[j]++;
				packed_dm_idx++;
			}

			auto& bm = bsd.block_modes[packed_bm_idx];

			bm.decimation_mode = static_cast<uint8_t>(decimation_mode);
			bm.quant_mode = static_cast<uint8_t>(quant_mode);
			bm.is_dual_plane = static_cast<uint8_t>(is_dual_plane);
			bm.weight_bits = static_cast<uint8_t>(weight_bits);
			bm.mode_index = static_cast<uint16_t>(i);

			auto& dm = bsd.decimation_modes[decimation_mode];

			if (is_dual_plane)
			{
				dm.set_ref_2plane(bm.get_weight_quant_mode());
			}
			else
			{
				dm.set_ref_1plane(bm.get_weight_quant_mode());
			}

			bsd.block_mode_packed_index[i] = static_cast<uint16_t>(packed_bm_idx);

			packed_bm_idx++;
			bm_counts[j]++;
		}
	}

	bsd.block_mode_count_1plane_always = bm_counts[0];
	bsd.block_mode_count_1plane_selected = bm_counts[0] + bm_counts[1];
	bsd.block_mode_count_1plane_2plane_selected = bm_counts[0] + bm_counts[1] + bm_counts[2];
	bsd.block_mode_count_all = bm_counts[0] + bm_counts[1] + bm_counts[2] + bm_counts[3];

	bsd.decimation_mode_count_always = dm_counts[0];
	bsd.decimation_mode_count_selected = dm_counts[0] + dm_counts[1] + dm_counts[2];
	bsd.decimation_mode_count_all = dm_counts[0] + dm_counts[1] + dm_counts[2] + dm_counts[3];

#if !defined(ASTCENC_DECOMPRESS_ONLY)
	assert(bsd.block_mode_count_1plane_always > 0);
	assert(bsd.decimation_mode_count_always > 0);

	delete[] percentiles;
#endif

	// Ensure the end of the array contains valid data (should never get read)
	for (unsigned int i = bsd.decimation_mode_count_all; i < WEIGHTS_MAX_DECIMATION_MODES; i++)
	{
		bsd.decimation_modes[i].maxprec_1plane = -1;
		bsd.decimation_modes[i].maxprec_2planes = -1;
		bsd.decimation_modes[i].refprec_1plane = 0;
		bsd.decimation_modes[i].refprec_2planes = 0;
	}

	// Determine the texels to use for kmeans clustering.
	assign_kmeans_texels(bsd);

	delete wb;
}